

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O3

void __thiscall duckdb::MergeSorter::ComputeMerge(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_00;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_01;
  SortedBlock *this_02;
  ulong uVar1;
  ulong uVar2;
  SortLayout *pSVar3;
  SortedBlock *this_03;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  uint uVar6;
  type pSVar7;
  type pSVar8;
  reference pvVar9;
  pointer pRVar10;
  pointer pSVar11;
  ulong uVar12;
  type pSVar13;
  type left;
  type right;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  data_ptr_t str1;
  data_ptr_t str2;
  idx_t iVar17;
  idx_t iVar18;
  data_ptr_t local_88;
  data_ptr_t local_80;
  ulong local_78;
  SortedBlock *local_70;
  bool *local_68;
  idx_t local_60;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_58;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_50;
  idx_t local_48;
  idx_t iStack_40;
  
  this_00 = &this->left;
  local_68 = left_smaller;
  pSVar7 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_00);
  this_01 = &this->right;
  pSVar8 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_01);
  local_60 = pSVar7->block_idx;
  uVar15 = pSVar7->entry_idx;
  local_48 = pSVar8->block_idx;
  iStack_40 = pSVar8->entry_idx;
  local_78 = uVar15;
  if (*count != 0) {
    this_02 = pSVar7->sb;
    local_70 = pSVar8->sb;
    local_50 = &this_02->blob_sorting_data;
    local_58 = &local_70->blob_sorting_data;
    uVar16 = 0;
    do {
      this_03 = local_70;
      if (pSVar7->block_idx <
          (ulong)((long)(this_02->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_02->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::operator[](&this_02->radix_sorting_data,pSVar7->block_idx);
        pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar9);
        if (uVar15 == pRVar10->count) {
          pSVar7->block_idx = pSVar7->block_idx + 1;
          pSVar7->entry_idx = 0;
        }
      }
      uVar15 = pSVar8->block_idx;
      if (uVar15 < (ulong)((long)(this_03->radix_sorting_data).
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_03->radix_sorting_data).
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar17 = pSVar8->entry_idx;
        pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::operator[](&this_03->radix_sorting_data,uVar15);
        pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar9);
        uVar15 = pSVar8->block_idx;
        if (iVar17 == pRVar10->count) {
          uVar15 = uVar15 + 1;
          pSVar8->block_idx = uVar15;
          pSVar8->entry_idx = 0;
        }
      }
      if ((pSVar7->block_idx ==
           (long)(this_02->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_02->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) ||
         (uVar15 == (long)(this_03->radix_sorting_data).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_03->radix_sorting_data).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)) break;
      pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_00);
      SBScanState::PinRadix(pSVar11,pSVar7->block_idx);
      pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_00);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pSVar11->radix_handle).node);
      str1 = ((pSVar11->radix_handle).node.ptr)->buffer +
             pSVar11->sort_layout->entry_size * pSVar11->entry_idx;
      local_80 = str1;
      pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_01);
      SBScanState::PinRadix(pSVar11,pSVar8->block_idx);
      pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_01);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pSVar11->radix_handle).node);
      str2 = ((pSVar11->radix_handle).node.ptr)->buffer +
             pSVar11->sort_layout->entry_size * pSVar11->entry_idx;
      local_88 = str2;
      pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::operator[](&this_02->radix_sorting_data,pSVar7->block_idx);
      pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar9);
      uVar1 = pRVar10->count;
      pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::operator[](&local_70->radix_sorting_data,pSVar8->block_idx);
      pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar9);
      uVar2 = pRVar10->count;
      pSVar3 = this->sort_layout;
      if (pSVar3->all_constant == true) {
        uVar12 = *count;
        uVar15 = pSVar7->entry_idx;
        pdVar4 = str2;
        pdVar5 = str1;
        if ((uVar16 < uVar12) && (uVar15 < uVar1)) {
          uVar14 = pSVar8->entry_idx;
          while (pdVar4 = str2, pdVar5 = str1, uVar14 < uVar2) {
            uVar6 = FastMemcmp(str1,str2,pSVar3->comparison_size);
            local_68[uVar16] = SUB41(uVar6 >> 0x1f,0);
            pSVar7->entry_idx = pSVar7->entry_idx + (ulong)(uVar6 >> 0x1f);
            uVar14 = (ulong)(-1 < (int)uVar6) + pSVar8->entry_idx;
            pSVar8->entry_idx = uVar14;
            pSVar3 = this->sort_layout;
            iVar17 = 0;
            if (-1 < (int)uVar6) {
              iVar17 = pSVar3->entry_size;
            }
            str1 = str1 + pSVar3->entry_size * (ulong)(uVar6 >> 0x1f);
            str2 = str2 + iVar17;
            uVar16 = uVar16 + 1;
            uVar12 = *count;
            uVar15 = pSVar7->entry_idx;
            pdVar4 = str2;
            pdVar5 = str1;
            if ((uVar12 <= uVar16) || (uVar1 <= uVar15)) break;
          }
        }
      }
      else {
        pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->(this_00);
        pSVar13 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(local_50);
        SBScanState::PinData(pSVar11,pSVar13);
        pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->(this_01);
        pSVar13 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(local_58);
        SBScanState::PinData(pSVar11,pSVar13);
        uVar12 = *count;
        uVar15 = pSVar7->entry_idx;
        pdVar4 = local_88;
        pdVar5 = local_80;
        if ((uVar16 < uVar12) && (uVar15 < uVar1)) {
          uVar14 = pSVar8->entry_idx;
          while (pdVar4 = local_88, pdVar5 = local_80, uVar14 < uVar2) {
            left = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                   operator*(this_00);
            right = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                    ::operator*(this_01);
            uVar6 = Comparators::CompareTuple
                              (left,right,&local_80,&local_88,this->sort_layout,
                               &this->state->external);
            local_68[uVar16] = SUB41(uVar6 >> 0x1f,0);
            pSVar7->entry_idx = pSVar7->entry_idx + (ulong)(uVar6 >> 0x1f);
            uVar14 = (ulong)(-1 < (int)uVar6) + pSVar8->entry_idx;
            pSVar8->entry_idx = uVar14;
            iVar17 = this->sort_layout->entry_size;
            iVar18 = 0;
            if (-1 < (int)uVar6) {
              iVar18 = iVar17;
            }
            str1 = str1 + iVar17 * (uVar6 >> 0x1f);
            str2 = str2 + iVar18;
            uVar16 = uVar16 + 1;
            uVar12 = *count;
            uVar15 = pSVar7->entry_idx;
            pdVar4 = str2;
            pdVar5 = str1;
            if ((uVar12 <= uVar16) || (local_88 = str2, local_80 = str1, uVar1 <= uVar15)) break;
          }
        }
      }
      local_80 = pdVar5;
      local_88 = pdVar4;
    } while (uVar16 < uVar12);
  }
  pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(this_00);
  pSVar11->block_idx = local_60;
  pSVar11->entry_idx = local_78;
  pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(this_01);
  pSVar11->block_idx = local_48;
  pSVar11->entry_idx = iStack_40;
  return;
}

Assistant:

void MergeSorter::ComputeMerge(const idx_t &count, bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	auto &l_sorted_block = *l.sb;
	auto &r_sorted_block = *r.sb;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;
	// Data pointers for both sides
	data_ptr_t l_radix_ptr;
	data_ptr_t r_radix_ptr;
	// Compute the merge of the next 'count' tuples
	idx_t compared = 0;
	while (compared < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_sorted_block.radix_sorting_data.size() &&
		    l.entry_idx == l_sorted_block.radix_sorting_data[l.block_idx]->count) {
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_sorted_block.radix_sorting_data.size() &&
		    r.entry_idx == r_sorted_block.radix_sorting_data[r.block_idx]->count) {
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_sorted_block.radix_sorting_data.size();
		const bool r_done = r.block_idx == r_sorted_block.radix_sorting_data.size();
		if (l_done || r_done) {
			// One of the sides is exhausted, no need to compare
			break;
		}
		// Pin the radix sorting data
		left->PinRadix(l.block_idx);
		l_radix_ptr = left->RadixPtr();
		right->PinRadix(r.block_idx);
		r_radix_ptr = right->RadixPtr();

		const idx_t l_count = l_sorted_block.radix_sorting_data[l.block_idx]->count;
		const idx_t r_count = r_sorted_block.radix_sorting_data[r.block_idx]->count;
		// Compute the merge
		if (sort_layout.all_constant) {
			// All sorting columns are constant size
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] = FastMemcmp(l_radix_ptr, r_radix_ptr, sort_layout.comparison_size) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		} else {
			// Pin the blob data
			left->PinData(*l_sorted_block.blob_sorting_data);
			right->PinData(*r_sorted_block.blob_sorting_data);
			// Merge with variable size sorting columns
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] =
				    Comparators::CompareTuple(*left, *right, l_radix_ptr, r_radix_ptr, sort_layout, state.external) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}